

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O3

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyOneShapeConstraints
          (TPZElementMatrixT<std::complex<double>_> *this,int constraintindex)

{
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *plVar1;
  undefined8 *puVar2;
  int iVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  complex<double> *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  _List_node_base *p_Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  
  p_Var20 = (this->super_TPZElementMatrix).fOneRestraints.
            super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  plVar1 = &(this->super_TPZElementMatrix).fOneRestraints;
  if (p_Var20 != (_List_node_base *)plVar1) {
    p_Var4 = (_List_node_base *)
             (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
             super_TPZVec<long>.fStore[constraintindex];
    iVar3 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[constraintindex].pos;
    lVar5 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
            super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
    lVar6 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
            super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
    do {
      if ((p_Var20[1]._M_prev)->_M_next == p_Var4) {
        lVar18 = (long)*(int *)&(p_Var20[1]._M_prev)->_M_prev + (long)iVar3;
        lVar22 = 1;
        do {
          uVar7 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                  super_TPZVec<long>.fNElements;
          if ((long)uVar7 < 1) {
            uVar16 = 0;
            uVar17 = 0;
          }
          else {
            uVar16 = 0;
            do {
              uVar17 = uVar16;
              if ((_List_node_base *)
                  (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                  super_TPZVec<long>.fStore[uVar16] == p_Var20[1]._M_prev[lVar22]._M_next) break;
              uVar16 = uVar16 + 1;
              uVar17 = uVar7;
            } while (uVar7 != uVar16);
            uVar16 = uVar17 & 0xffffffff;
          }
          if (uVar7 == uVar17) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZElementMatrixT.cpp"
                       ,0x178);
          }
          lVar23 = (long)*(int *)&p_Var20[1]._M_prev[lVar22]._M_prev +
                   (long)(this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar16].
                         pos;
          dVar13 = (double)-(*(int *)((long)&(p_Var20[7]._M_prev)->_M_next + lVar22 * 4) /
                            *(int *)&(p_Var20[7]._M_prev)->_M_next);
          if ((this->super_TPZElementMatrix).fType == EK) {
            if (0 < lVar5) {
              lVar19 = 0;
              do {
                lVar21 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
                lVar8 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
                if ((lVar8 <= lVar19 || lVar21 <= lVar18) || lVar18 < 0) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
                lVar15 = lVar21 * lVar19;
                if (((lVar23 < 0) || (lVar21 <= lVar23)) || (lVar8 <= lVar19)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar14 = *(double *)(pcVar9[lVar15 + lVar23]._M_value + 8) +
                         *(double *)(pcVar9[lVar15 + lVar18]._M_value + 8) * dVar13;
                auVar10._8_4_ = SUB84(dVar14,0);
                auVar10._0_8_ =
                     *(double *)pcVar9[lVar15 + lVar23]._M_value +
                     *(double *)pcVar9[lVar15 + lVar18]._M_value * dVar13;
                auVar10._12_4_ = (int)((ulong)dVar14 >> 0x20);
                *(undefined1 (*) [16])pcVar9[lVar15 + lVar23]._M_value = auVar10;
                lVar19 = lVar19 + 1;
              } while (lVar5 != lVar19);
              goto LAB_0115b171;
            }
          }
          else {
            if (0 < lVar6) {
              lVar19 = 0;
              do {
                lVar21 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
                lVar8 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
                if ((lVar8 <= lVar19 || lVar21 <= lVar18) || lVar18 < 0) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
                lVar15 = lVar21 * lVar19;
                if (((lVar23 < 0) || (lVar21 <= lVar23)) || (lVar8 <= lVar19)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar14 = *(double *)(pcVar9[lVar15 + lVar23]._M_value + 8) +
                         *(double *)(pcVar9[lVar15 + lVar18]._M_value + 8) * dVar13;
                auVar12._8_4_ = SUB84(dVar14,0);
                auVar12._0_8_ =
                     *(double *)pcVar9[lVar15 + lVar23]._M_value +
                     *(double *)pcVar9[lVar15 + lVar18]._M_value * dVar13;
                auVar12._12_4_ = (int)((ulong)dVar14 >> 0x20);
                *(undefined1 (*) [16])pcVar9[lVar15 + lVar23]._M_value = auVar12;
                lVar19 = lVar19 + 1;
              } while (lVar6 != lVar19);
            }
LAB_0115b171:
            if ((this->super_TPZElementMatrix).fType == EK && 0 < lVar5) {
              lVar19 = 0;
              lVar21 = 0;
              do {
                lVar8 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
                if (((lVar8 <= lVar21) || (lVar18 < 0)) ||
                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar18)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
                if (((lVar8 <= lVar21) || (lVar23 < 0)) ||
                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar23)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar14 = *(double *)((long)(pcVar9[lVar8 * lVar23]._M_value + lVar19) + 8) +
                         *(double *)((long)(pcVar9[lVar8 * lVar18]._M_value + lVar19) + 8) * dVar13;
                auVar11._8_4_ = SUB84(dVar14,0);
                auVar11._0_8_ =
                     *(double *)(pcVar9[lVar8 * lVar23]._M_value + lVar19) +
                     *(double *)(pcVar9[lVar8 * lVar18]._M_value + lVar19) * dVar13;
                auVar11._12_4_ = (int)((ulong)dVar14 >> 0x20);
                *(undefined1 (*) [16])(pcVar9[lVar8 * lVar23]._M_value + lVar19) = auVar11;
                lVar21 = lVar21 + 1;
                lVar19 = lVar19 + 0x10;
              } while (lVar5 != lVar21);
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 4);
        if ((this->super_TPZElementMatrix).fType == EK) {
          if (0 < lVar5) {
            lVar23 = 0;
            lVar22 = 0;
            do {
              lVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
              if (((lVar19 <= lVar22) || (lVar18 < 0)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar18)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              puVar2 = (undefined8 *)
                       ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem
                        [lVar19 * lVar18]._M_value + lVar23);
              *puVar2 = 0;
              puVar2[1] = 0;
              if (((lVar18 < 0) ||
                  (lVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                            super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow,
                  lVar19 <= lVar18)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar22)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar19 = lVar19 * lVar22;
              lVar22 = lVar22 + 1;
              pcVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                       lVar19 + lVar18;
              *(undefined8 *)pcVar9->_M_value = 0;
              *(undefined8 *)(pcVar9->_M_value + 8) = 0;
              lVar23 = lVar23 + 0x10;
            } while (lVar5 != lVar22);
          }
          if (((lVar18 < 0) ||
              (lVar22 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow,
              lVar22 <= lVar18)) ||
             ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
              super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar18)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                   lVar22 * lVar18 + lVar18;
          *(undefined8 *)pcVar9->_M_value = 0x3ff0000000000000;
          *(undefined8 *)(pcVar9->_M_value + 8) = 0;
        }
        else if (0 < lVar6) {
          lVar22 = 0;
          do {
            if (((lVar18 < 0) ||
                (lVar23 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow,
                lVar23 <= lVar18)) ||
               ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar22)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar23 = lVar23 * lVar22;
            lVar22 = lVar22 + 1;
            pcVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                     lVar23 + lVar18;
            *(undefined8 *)pcVar9->_M_value = 0;
            *(undefined8 *)(pcVar9->_M_value + 8) = 0;
          } while (lVar6 != lVar22);
        }
      }
      p_Var20 = p_Var20->_M_next;
    } while (p_Var20 != (_List_node_base *)plVar1);
  }
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyOneShapeConstraints(int constraintindex)
{
    int64_t dfnindex = this->fConstrConnect[constraintindex];


#ifdef PZ_LOG
    int count = 0;
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        count++;
    }
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix before ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKBefore = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    int64_t inpos = this->fConstrBlock.Position(constraintindex);
    int64_t toteq = this->fConstrMat.Rows();
    int64_t nrhs = this->fConstrMat.Cols();

    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        int64_t send = inpos+it->fFaces[0].second;
        for (int id=1; id<4; id++) {
            int64_t depindex = it->fFaces[id].first;
            int locdep = 0;
            for (locdep = 0; locdep < fConstrConnect.size(); locdep++) {
                if (fConstrConnect[locdep] == depindex) {
                    break;
                }
            }
            if (locdep == fConstrConnect.size()) {
                DebugStop();
            }
            int64_t deppos = this->fConstrBlock.Position(locdep);
            int64_t receive = deppos+it->fFaces[id].second;
            REAL coef = -it->fOrient[id]/it->fOrient[0];
            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EK
            else
            {
                
                for(int ieq=0; ieq<nrhs; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EF

            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++)
                {
                    (this->fConstrMat)(ieq,receive) += coef*(this->fConstrMat)(ieq,send);
                }
            }//EK

        }
        if (this->fType == TPZElementMatrix::EK){
            for(int ieq=0; ieq<toteq; ieq++)
            {
                (this->fConstrMat)(ieq,send) = 0.;
                (this->fConstrMat)(send,ieq) = 0.;
            }
            (this->fConstrMat)(send,send) = 1.;
        }//EK
        else
        {
            for(int ieq=0; ieq<nrhs; ieq++) {
                (this->fConstrMat)(send,ieq) = 0.;
            }
        }

    }
#ifdef PZ_LOG
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix after ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKAfter = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}